

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.h
# Opt level: O3

void __thiscall
__gnu_cxx::new_allocator<wabt::interp::FuncDesc>::
construct<wabt::interp::FuncDesc,wabt::interp::FuncDesc>
          (new_allocator<wabt::interp::FuncDesc> *this,FuncDesc *__p,FuncDesc *__args)

{
  pointer pTVar1;
  pointer pLVar2;
  pointer pHVar3;
  
  (__p->type).super_ExternType.kind = (__args->type).super_ExternType.kind;
  (__p->type).super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00242880;
  pTVar1 = (__args->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (__p->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (__args->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__p->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar1;
  (__p->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (__args->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__args->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar1 = (__args->type).results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (__p->type).results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (__args->type).results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__p->type).results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar1;
  (__p->type).results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (__args->type).results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__args->type).results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->type).results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->type).results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar2 = (__args->locals).
           super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (__p->locals).
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (__args->locals).
       super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl
       .super__Vector_impl_data._M_start;
  (__p->locals).
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = pLVar2;
  (__p->locals).
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (__args->locals).
       super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (__args->locals).
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->locals).
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->locals).
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __p->code_offset = __args->code_offset;
  pHVar3 = (__args->handlers).
           super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__p->handlers).
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (__args->handlers).
       super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__p->handlers).
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = pHVar3;
  (__p->handlers).
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (__args->handlers).
       super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->handlers).
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->handlers).
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->handlers).
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

virtual ~ExternType() {}